

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O3

Token lex(ptrlen *text,ptrlen *token,char **err)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  _Bool _Var4;
  Token TVar5;
  char *pcVar6;
  uint uVar7;
  size_t sVar8;
  byte *pbVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  ptrlen pl1;
  ptrlen pl2;
  
  pbVar12 = (byte *)text->ptr;
  sVar8 = text->len;
  pbVar1 = pbVar12 + sVar8;
  TVar5 = TOK_END;
  pbVar11 = pbVar12;
  if (0 < (long)sVar8) {
    do {
      bVar2 = *pbVar11;
      if (4 < bVar2 - 9) {
        uVar7 = (uint)bVar2;
        if (uVar7 < 0x2a) {
          if ((ulong)uVar7 == 0x20) goto LAB_001388e2;
          if ((0x34200000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_0013890f;
        }
        else {
LAB_0013890f:
          if (bVar2 != 0x7c) {
            if ((((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
               ((uVar7 = bVar2 - 0x2a, uVar7 < 0x36 &&
                ((0x2a000000210039U >> ((ulong)uVar7 & 0x3f) & 1) != 0)))) {
              pbVar9 = pbVar11 + 1;
              TVar5 = TOK_ATOM;
              pbVar12 = pbVar9;
              while ((pbVar9 < pbVar1 &&
                     (((bVar2 = *pbVar9, (byte)(bVar2 - 0x30) < 10 ||
                       ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
                      ((pbVar12 = pbVar9, bVar2 - 0x2a < 0x36 &&
                       ((0x2a000000210039U >> ((ulong)(bVar2 - 0x2a) & 0x3f) & 1) != 0))))))) {
                pbVar9 = pbVar9 + 1;
                pbVar12 = pbVar1;
              }
            }
            else {
              pbVar12 = pbVar11 + 1;
              pcVar6 = dupstr("unexpected character in expression");
              *err = pcVar6;
              TVar5 = TOK_ERROR;
            }
            break;
          }
        }
        lVar10 = 0;
        goto LAB_00138930;
      }
LAB_001388e2:
      pbVar12 = pbVar11 + 1;
      sVar8 = sVar8 - 1;
      pbVar11 = pbVar12;
    } while (pbVar12 < pbVar1);
  }
  goto LAB_0013898f;
  while (lVar10 = lVar10 + 0x18, lVar10 != 0x78) {
LAB_00138930:
    uVar3 = *(ulong *)((long)&lex::operators[0].text.len + lVar10);
    if ((uVar3 <= sVar8) &&
       (pl1.len = uVar3, pl1.ptr = *(void **)((long)&lex::operators[0].text.ptr + lVar10),
       pl2.len = uVar3, pl2.ptr = pbVar11, _Var4 = ptrlen_eq_ptrlen(pl1,pl2), _Var4)) {
      pbVar12 = pbVar11 + uVar3;
      TVar5 = *(Token *)((long)&lex::operators[0].type + lVar10);
      goto LAB_0013898f;
    }
  }
  pbVar12 = pbVar11 + 1;
  pcVar6 = dupstr("unrecognised boolean operator");
  *err = pcVar6;
  TVar5 = TOK_ERROR;
LAB_0013898f:
  token->ptr = pbVar11;
  token->len = (long)pbVar12 - (long)pbVar11;
  text->ptr = pbVar12;
  text->len = (long)pbVar1 - (long)pbVar12;
  return TVar5;
}

Assistant:

static Token lex(ptrlen *text, ptrlen *token, char **err)
{
    const char *p = text->ptr, *e = p + text->len;
    Token type = TOK_ERROR;

    /* Skip whitespace */
    while (p < e && is_space(*p))
        p++;

    const char *start = p;

    if (!(p < e)) {
        type = TOK_END;
        goto out;
    }

    if (is_operator_char(*p)) {
        /* Match boolean-expression tokens */
        static const struct operator {
            ptrlen text;
            Token type;
        } operators[] = {
            {PTRLEN_DECL_LITERAL("("), TOK_LPAR},
            {PTRLEN_DECL_LITERAL(")"), TOK_RPAR},
            {PTRLEN_DECL_LITERAL("&&"), TOK_AND},
            {PTRLEN_DECL_LITERAL("||"), TOK_OR},
            {PTRLEN_DECL_LITERAL("!"), TOK_NOT},
        };

        for (size_t i = 0; i < lenof(operators); i++) {
            const struct operator *op = &operators[i];
            if (e - p >= op->text.len &&
                ptrlen_eq_ptrlen(op->text, make_ptrlen(p, op->text.len))) {
                p += op->text.len;
                type = op->type;
                goto out;
            }
        }

        /*
         * Report an error if one of the operator characters is used
         * in a way that doesn't match something in that table (e.g. a
         * single &).
         */
        p++;
        type = TOK_ERROR;
        *err = dupstr("unrecognised boolean operator");
        goto out;
    } else if (is_atom_char(*p)) {
        /*
         * Match an 'atom' token, which is any non-empty sequence of
         * characters from the combined set that allows hostname
         * wildcards, IP address ranges and special predicates like
         * port numbers.
         */
        do {
            p++;
        } while (p < e && is_atom_char(*p));

        type = TOK_ATOM;
        goto out;
    } else {
        /*
         * Otherwise, report an error.
         */
        p++;
        type = TOK_ERROR;
        *err = dupstr("unexpected character in expression");
        goto out;
    }

  out:
    *token = make_ptrlen(start, p - start);
    text->ptr = p;
    text->len = e - p;
    return type;
}